

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O2

CmdLineItem * __thiscall Omega_h::CmdLineFlag::arg(CmdLineFlag *this,string *arg_name)

{
  pointer puVar1;
  __type _Var2;
  pointer puVar3;
  
  puVar3 = (this->args_).
           super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->args_).
           super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar3 == puVar1) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_cmdline.cpp"
           ,0x82);
    }
    _Var2 = std::operator==(&((puVar3->_M_t).
                              super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>
                              .super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>._M_head_impl)->
                             name_,arg_name);
    if (_Var2) break;
    puVar3 = puVar3 + 1;
  }
  return (puVar3->_M_t).
         super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>.
         _M_t.
         super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>.
         super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>._M_head_impl;
}

Assistant:

CmdLineItem* CmdLineFlag::arg(std::string const& arg_name) {
  for (auto const& the_arg : args_)
    if (the_arg->name() == arg_name) return the_arg.get();
  OMEGA_H_NORETURN(nullptr);
}